

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

pair<void_*,_embree::BBox<embree::Vec3fa>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:81:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:86:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:91:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:107:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:122:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:127:9)>
::createLargeLeaf(pair<void_*,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr__,
                 BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:81:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:86:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:91:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:107:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:122:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:127:9)>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  ulong uVar1;
  ulong uVar2;
  CachedAllocator alloc_00;
  ulong uVar3;
  void *node;
  long lVar4;
  undefined8 *puVar5;
  range<unsigned_int> *current_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  range<unsigned_int> rVar9;
  uint uVar10;
  ulong uVar11;
  range<unsigned_int> rVar12;
  Vec3fa *pVVar13;
  ulong N;
  size_t sVar14;
  bool bVar15;
  range<unsigned_int> children [8];
  pair<void_*,_embree::BBox<embree::Vec3fa>_> local_1e8;
  pair<void_*,_embree::BBox<embree::Vec3fa>_> bounds [8];
  
  if ((this->super_Settings).maxDepth < depth) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)bounds,"depth limit reached",(allocator *)children);
    *puVar5 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar5 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar5 + 2),(string *)bounds);
    __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar1 = (this->super_Settings).maxLeafSize;
  if (uVar1 < current->_end - current->_begin) {
    children[0] = *current;
    uVar2 = (this->super_Settings).branchingFactor;
    N = 1;
    do {
      uVar8 = 0;
      uVar6 = 0xffffffffffffffff;
      for (uVar7 = 0; N != uVar7; uVar7 = uVar7 + 1) {
        uVar11 = (ulong)(children[uVar7]._end - children[uVar7]._begin);
        uVar3 = uVar7;
        if (uVar11 <= uVar1 || uVar11 <= uVar8) {
          uVar11 = uVar8;
          uVar3 = uVar6;
        }
        uVar6 = uVar3;
        uVar8 = uVar11;
      }
      if (uVar6 == 0xffffffffffffffff) break;
      uVar10 = children[uVar6]._end + children[uVar6]._begin >> 1;
      rVar9._end = children[uVar6]._end;
      rVar9._begin = uVar10;
      rVar12._end = uVar10;
      rVar12._begin = children[uVar6]._begin;
      children[uVar6] = children[N - 1];
      children[N - 1] = rVar12;
      children[N] = rVar9;
      N = N + 1;
    } while (N < uVar2);
    node = (**this->createNode->createNode)
                     ((RTCThreadLocalAllocator)&alloc,(uint)N,*this->createNode->userPtr);
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&bounds[0].first + lVar4) = 0;
      lVar4 = lVar4 + 0x30;
    } while (lVar4 != 0x180);
    current_00 = children;
    pVVar13 = &bounds[0].second.upper;
    sVar14 = N;
    while (bVar15 = sVar14 != 0, sVar14 = sVar14 - 1, bVar15) {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      createLargeLeaf(&local_1e8,this,depth + 1,current_00,alloc_00);
      *(void **)(pVVar13 + -2) = local_1e8.first;
      *(undefined8 *)&(((BBox<embree::Vec3fa> *)(pVVar13 + -1))->lower).field_0 =
           local_1e8.second.lower.field_0._0_8_;
      *(undefined8 *)((long)&(((BBox<embree::Vec3fa> *)(pVVar13 + -1))->lower).field_0 + 8) =
           local_1e8.second.lower.field_0._8_8_;
      *(undefined8 *)&pVVar13->field_0 = local_1e8.second.upper.field_0._0_8_;
      *(undefined8 *)((long)&pVVar13->field_0 + 8) = local_1e8.second.upper.field_0._8_8_;
      current_00 = current_00 + 1;
      pVVar13 = pVVar13 + 3;
    }
    rtcBuildBVHMorton::anon_class_24_3_49846c50::operator()
              (__return_storage_ptr__,this->setBounds,node,bounds,N);
  }
  else {
    rtcBuildBVHMorton::anon_class_40_5_06182577::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
  }
  return __return_storage_ptr__;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }